

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O0

int tbx_parse1(tbx_conf_t *conf,int len,char *line,tbx_intv_t *intv)

{
  undefined1 uVar1;
  long lVar2;
  int c;
  long x;
  char *t;
  int op;
  int l;
  char *s;
  int ncols;
  int id;
  int b;
  int i;
  tbx_intv_t *intv_local;
  char *line_local;
  tbx_conf_t *ptStack_18;
  int len_local;
  tbx_conf_t *conf_local;
  
  ncols = 0;
  s._4_4_ = 1;
  s._0_4_ = 0;
  intv->se = (char *)0x0;
  intv->ss = (char *)0x0;
  intv->end = -1;
  intv->beg = -1;
  id = 0;
  _b = intv;
  intv_local = (tbx_intv_t *)line;
  line_local._4_4_ = len;
  ptStack_18 = conf;
  do {
    if (line_local._4_4_ < id) {
      if ((((_b->ss == (char *)0x0) || (_b->se == (char *)0x0)) || (_b->beg < 0)) || (_b->end < 0))
      {
        conf_local._4_4_ = -1;
      }
      else {
        conf_local._4_4_ = 0;
      }
      return conf_local._4_4_;
    }
    if ((*(char *)((long)&intv_local->beg + (long)id) == '\t') ||
       (*(char *)((long)&intv_local->beg + (long)id) == '\0')) {
      s._0_4_ = (int)s + 1;
      if (s._4_4_ == ptStack_18->sc) {
        _b->ss = (char *)((long)&intv_local->beg + (long)ncols);
        _b->se = (char *)((long)&intv_local->beg + (long)id);
      }
      else if (s._4_4_ == ptStack_18->bc) {
        lVar2 = strtol((char *)((long)&intv_local->beg + (long)ncols),(char **)&op,0);
        _b->end = lVar2;
        _b->beg = lVar2;
        if (_op == (char *)((long)&intv_local->beg + (long)ncols)) {
          return -1;
        }
        if ((ptStack_18->preset & 0x10000U) == 0) {
          _b->beg = _b->beg + -1;
        }
        else {
          _b->end = _b->end + 1;
        }
        if (_b->beg < 0) {
          _b->beg = 0;
        }
        if (_b->end < 1) {
          _b->end = 1;
        }
      }
      else if ((ptStack_18->preset & 0xffffU) == 0) {
        if (s._4_4_ == ptStack_18->ec) {
          lVar2 = strtol((char *)((long)&intv_local->beg + (long)ncols),(char **)&op,0);
          _b->end = lVar2;
          if (_op == (char *)((long)&intv_local->beg + (long)ncols)) {
            return -1;
          }
        }
      }
      else if ((ptStack_18->preset & 0xffffU) == 1) {
        if (s._4_4_ == 6) {
          t._4_4_ = 0;
          _op = (char *)((long)&intv_local->beg + (long)ncols);
          while (_op < (char *)((long)&intv_local->beg + (long)id)) {
            lVar2 = strtol(_op,(char **)&x,10);
            t._0_4_ = toupper((int)*(char *)x);
            if ((((int)t == 0x4d) || ((int)t == 0x44)) || ((int)t == 0x4e)) {
              t._4_4_ = t._4_4_ + (int)lVar2;
            }
            _op = (char *)(x + 1);
          }
          if (t._4_4_ == 0) {
            t._4_4_ = 1;
          }
          _b->end = _b->beg + (long)t._4_4_;
        }
      }
      else if ((ptStack_18->preset & 0xffffU) == 2) {
        if (s._4_4_ == 4) {
          if (ncols < id) {
            _b->end = _b->beg + (long)(id - ncols);
          }
        }
        else if (s._4_4_ == 8) {
          uVar1 = *(undefined1 *)((long)&intv_local->beg + (long)id);
          *(undefined1 *)((long)&intv_local->beg + (long)id) = 0;
          _op = strstr((char *)((long)&intv_local->beg + (long)ncols),"END=");
          if (_op == (char *)((long)&intv_local->beg + (long)ncols)) {
            _op = _op + 4;
          }
          else if ((_op != (char *)0x0) &&
                  (_op = strstr((char *)((long)&intv_local->beg + (long)ncols),";END="),
                  _op != (char *)0x0)) {
            _op = _op + 5;
          }
          if (_op != (char *)0x0) {
            lVar2 = strtol(_op,(char **)&op,0);
            _b->end = lVar2;
          }
          *(undefined1 *)((long)&intv_local->beg + (long)id) = uVar1;
        }
      }
      ncols = id + 1;
      s._4_4_ = s._4_4_ + 1;
    }
    id = id + 1;
  } while( true );
}

Assistant:

int tbx_parse1(const tbx_conf_t *conf, int len, char *line, tbx_intv_t *intv)
{
    int i, b = 0, id = 1, ncols = 0;
    char *s;
    intv->ss = intv->se = 0; intv->beg = intv->end = -1;
    for (i = 0; i <= len; ++i) {
        if (line[i] == '\t' || line[i] == 0) {
            ++ncols;
            if (id == conf->sc) {
                intv->ss = line + b; intv->se = line + i;
            } else if (id == conf->bc) {
                // here ->beg is 0-based.
                intv->beg = intv->end = strtol(line + b, &s, 0);
                if ( s==line+b ) return -1; // expected int
                if (!(conf->preset&TBX_UCSC)) --intv->beg;
                else ++intv->end;
                if (intv->beg < 0) intv->beg = 0;
                if (intv->end < 1) intv->end = 1;
            } else {
                if ((conf->preset&0xffff) == TBX_GENERIC) {
                    if (id == conf->ec)
                    {
                        intv->end = strtol(line + b, &s, 0);
                        if ( s==line+b ) return -1; // expected int
                    }
                } else if ((conf->preset&0xffff) == TBX_SAM) {
                    if (id == 6) { // CIGAR
                        int l = 0, op;
                        char *t;
                        for (s = line + b; s < line + i;) {
                            long x = strtol(s, &t, 10);
                            op = toupper(*t);
                            if (op == 'M' || op == 'D' || op == 'N') l += x;
                            s = t + 1;
                        }
                        if (l == 0) l = 1;
                        intv->end = intv->beg + l;
                    }
                } else if ((conf->preset&0xffff) == TBX_VCF) {
                    if (id == 4) {
                        if (b < i) intv->end = intv->beg + (i - b);
                    } else if (id == 8) { // look for "END="
                        int c = line[i];
                        line[i] = 0;
                        s = strstr(line + b, "END=");
                        if (s == line + b) s += 4;
                        else if (s) {
                            s = strstr(line + b, ";END=");
                            if (s) s += 5;
                        }
                        if (s) intv->end = strtol(s, &s, 0);
                        line[i] = c;
                    }
                }
            }
            b = i + 1;
            ++id;
        }
    }
    if (intv->ss == 0 || intv->se == 0 || intv->beg < 0 || intv->end < 0) return -1;
    return 0;
}